

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O1

bool __thiscall spvtools::opt::Instruction::IsVulkanUniformBuffer(Instruction *this)

{
  IRContext *pIVar1;
  DefUseManager *pDVar2;
  DecorationManager *this_00;
  uint32_t uVar3;
  Instruction *this_01;
  uint uVar4;
  bool is_block;
  undefined1 local_39;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  if (this->opcode_ != OpTypePointer) {
    return false;
  }
  uVar3 = (this->has_result_id_ & 1) + 1;
  if (this->has_type_id_ == false) {
    uVar3 = (uint)this->has_result_id_;
  }
  uVar3 = GetSingleWordOperand(this,uVar3);
  if (uVar3 == 2) {
    pIVar1 = this->context_;
    if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(pIVar1);
    }
    pDVar2 = (pIVar1->def_use_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
    uVar4 = (this->has_result_id_ & 1) + 1;
    if (this->has_type_id_ == false) {
      uVar4 = (uint)this->has_result_id_;
    }
    uVar3 = GetSingleWordOperand(this,uVar4 + 1);
    this_01 = analysis::DefUseManager::GetDef(pDVar2,uVar3);
    if ((this_01->opcode_ & ~OpUndef) == OpTypeArray) {
      pIVar1 = this->context_;
      if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
        IRContext::BuildDefUseManager(pIVar1);
      }
      pDVar2 = (pIVar1->def_use_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
      uVar3 = (this_01->has_result_id_ & 1) + 1;
      if (this_01->has_type_id_ == false) {
        uVar3 = (uint)this_01->has_result_id_;
      }
      uVar3 = GetSingleWordOperand(this_01,uVar3);
      this_01 = analysis::DefUseManager::GetDef(pDVar2,uVar3);
    }
    if (this_01->opcode_ == OpTypeStruct) {
      local_39 = 0;
      pIVar1 = this->context_;
      if ((pIVar1->valid_analyses_ & kAnalysisDecorations) == kAnalysisNone) {
        IRContext::BuildDecorationManager(pIVar1);
      }
      this_00 = (pIVar1->decoration_mgr_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
                .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>.
                _M_head_impl;
      uVar3 = 0;
      if (this_01->has_result_id_ == true) {
        uVar3 = GetSingleWordOperand(this_01,(uint)this_01->has_type_id_);
      }
      local_38._8_8_ = 0;
      local_38._M_unused._M_object = &local_39;
      pcStack_20 = std::
                   _Function_handler<void_(const_spvtools::opt::Instruction_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.cpp:461:7)>
                   ::_M_invoke;
      local_28 = std::
                 _Function_handler<void_(const_spvtools::opt::Instruction_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.cpp:461:7)>
                 ::_M_manager;
      analysis::DecorationManager::ForEachDecoration
                (this_00,uVar3,2,(function<void_(const_spvtools::opt::Instruction_&)> *)&local_38);
      if (local_28 == (code *)0x0) {
        return (bool)local_39;
      }
      (*local_28)(&local_38,&local_38,__destroy_functor);
      return (bool)local_39;
    }
  }
  return false;
}

Assistant:

bool Instruction::IsVulkanUniformBuffer() const {
  if (opcode() != spv::Op::OpTypePointer) {
    return false;
  }

  spv::StorageClass storage_class =
      spv::StorageClass(GetSingleWordInOperand(kPointerTypeStorageClassIndex));
  if (storage_class != spv::StorageClass::Uniform) {
    return false;
  }

  Instruction* base_type =
      context()->get_def_use_mgr()->GetDef(GetSingleWordInOperand(1));

  // Unpack the optional layer of arraying.
  if (base_type->opcode() == spv::Op::OpTypeArray ||
      base_type->opcode() == spv::Op::OpTypeRuntimeArray) {
    base_type = context()->get_def_use_mgr()->GetDef(
        base_type->GetSingleWordInOperand(0));
  }

  if (base_type->opcode() != spv::Op::OpTypeStruct) {
    return false;
  }

  bool is_block = false;
  context()->get_decoration_mgr()->ForEachDecoration(
      base_type->result_id(), uint32_t(spv::Decoration::Block),
      [&is_block](const Instruction&) { is_block = true; });
  return is_block;
}